

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngtrans.c
# Opt level: O3

void png_do_swap(png_row_infop row_info,png_bytep row)

{
  ushort *puVar1;
  int iVar2;
  long lVar3;
  
  if ((row_info->bit_depth == '\x10') &&
     (iVar2 = (uint)row_info->channels * row_info->width, iVar2 != 0)) {
    lVar3 = 0;
    do {
      puVar1 = (ushort *)(row + lVar3 * 2);
      *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
      lVar3 = lVar3 + 1;
    } while (iVar2 != (int)lVar3);
  }
  return;
}

Assistant:

void /* PRIVATE */
png_do_swap(png_row_infop row_info, png_bytep row)
{
   png_debug(1, "in png_do_swap");

   if (row_info->bit_depth == 16)
   {
      png_bytep rp = row;
      png_uint_32 i;
      png_uint_32 istop= row_info->width * row_info->channels;

      for (i = 0; i < istop; i++, rp += 2)
      {
#ifdef PNG_BUILTIN_BSWAP16_SUPPORTED
         /* Feature added to libpng-1.6.11 for testing purposes, not
          * enabled by default.
          */
         *(png_uint_16*)rp = __builtin_bswap16(*(png_uint_16*)rp);
#else
         png_byte t = *rp;
         *rp = *(rp + 1);
         *(rp + 1) = t;
#endif
      }
   }
}